

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

int __thiscall amrex::ParmParse::remove(ParmParse *this,char *__filename)

{
  _Alloc_hider _Var1;
  int iVar2;
  int iVar3;
  iterator __position;
  _List_node_base *p_Var4;
  bool bVar5;
  allocator local_79;
  char *local_78;
  string local_70;
  string local_50;
  
  __position._M_node =
       (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
        &((_List_node_base *)this->m_table)->_M_next)->_M_impl)._M_node.super__List_node_base.
       _M_next;
  if (__position._M_node == (_List_node_base *)this->m_table) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    local_78 = __filename;
    do {
      std::__cxx11::string::string((string *)&local_70,local_78,&local_79);
      prefixedName(&local_50,this,&local_70);
      _Var1._M_p = local_50._M_dataplus._M_p;
      bVar5 = false;
      if ((__position._M_node[4]._M_prev == (_List_node_base *)0x0) &&
         (__position._M_node[1]._M_prev == (_List_node_base *)local_50._M_string_length)) {
        if ((_List_node_base *)local_50._M_string_length == (_List_node_base *)0x0) {
          bVar5 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,__position._M_node[1]._M_next,
                       local_50._M_string_length);
          bVar5 = iVar2 == 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        p_Var4 = (__position._M_node)->_M_next;
        std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
        ::_M_erase(this->m_table,__position);
        iVar3 = iVar3 + 1;
      }
      else {
        p_Var4 = (__position._M_node)->_M_next;
      }
      __position._M_node = p_Var4;
    } while (p_Var4 != (_List_node_base *)this->m_table);
  }
  return iVar3;
}

Assistant:

int
ParmParse::remove (const char* name)
{
    int r = 0;
    for (auto it = m_table.begin(); it != m_table.end(); ) {
        if (ppfound(prefixedName(name), *it, false)) {
            it = m_table.erase(it);
            ++r;
        } else {
            ++it;
        }
    }
    return r;
}